

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.h
# Opt level: O0

void __thiscall
sfc::Map::Map(Map *this,Mode mode,uint map_width,uint map_height,uint tile_width,uint tile_height)

{
  uint tile_height_local;
  uint tile_width_local;
  uint map_height_local;
  uint map_width_local;
  Mode mode_local;
  Map *this_local;
  
  this->_mode = mode;
  this->_map_width = map_width;
  this->_map_height = map_height;
  this->_tile_width = tile_width;
  this->_tile_height = tile_height;
  std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>::vector(&this->_entries);
  std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>::resize
            (&this->_entries,(ulong)(map_width * map_height));
  return;
}

Assistant:

Map(Mode mode = Mode::snes, unsigned map_width = 32, unsigned map_height = 32, unsigned tile_width = 8, unsigned tile_height = 8)
  : _mode(mode), _map_width(map_width), _map_height(map_height), _tile_width(tile_width), _tile_height(tile_height) {
    _entries.resize(map_width * map_height);
  }